

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
jsoncons::jsonpatch::detail::jsonpatch_names<char>::remove_name_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  if (remove_name[abi:cxx11]()::name_abi_cxx11_ == '\0') {
    remove_name_abi_cxx11_();
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  return in_RDI;
}

Assistant:

static std::basic_string<CharT> remove_name()
        {
            static std::basic_string<CharT> name{'r','e','m','o','v','e'};
            return name;
        }